

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticPropsCmd.cpp
# Opt level: O0

void cmdline_parser_init(gengetopt_args_info *args_info)

{
  gengetopt_args_info *in_RDI;
  
  clear_given(in_RDI);
  clear_args(in_RDI);
  init_args_info(in_RDI);
  in_RDI->inputs = (char **)0x0;
  in_RDI->inputs_num = 0;
  return;
}

Assistant:

void
cmdline_parser_init (struct gengetopt_args_info *args_info)
{
  clear_given (args_info);
  clear_args (args_info);
  init_args_info (args_info);

  args_info->inputs = 0;
  args_info->inputs_num = 0;
}